

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O1

void __thiscall ArgumentParser::Instance::Consume(Instance *this,size_t pos,string_view arg)

{
  function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)> *pfVar1
  ;
  _Manager_type *pp_Var2;
  ActionMap *pAVar3;
  _Manager_type p_Var4;
  Continue CVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  char *pcVar8;
  size_t sVar9;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_t local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  pcVar8 = arg._M_str;
  sVar9 = arg._M_len;
  pAVar3 = this->Bindings;
  local_40._M_len = sVar9;
  local_40._M_str = pcVar8;
  cVar6 = KeywordActionMap::Find(&pAVar3->Keywords,arg);
  if (cVar6._M_current ==
      (pAVar3->Keywords).
      super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      .
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_58._M_len = sVar9;
    local_58._M_str = pcVar8;
    if ((this->KeywordValueFunc).super__Function_base._M_manager == (_Manager_type)0x0) {
      if ((this->DoneWithPositional == false) &&
         (cVar7 = PositionActionMap::Find(&pAVar3->Positions,pos),
         cVar7._M_current !=
         (pAVar3->Positions).
         super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
         .
         super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        local_48 = pos;
        if (((cVar7._M_current)->second).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*((cVar7._M_current)->second)._M_invoker)
                    ((_Any_data *)&(cVar7._M_current)->second,this,&local_48,&local_58);
          return;
        }
        goto LAB_00341963;
      }
      if ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
          this->UnparsedArguments !=
          (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   this->UnparsedArguments,&local_40);
      }
    }
    else {
      pfVar1 = &this->KeywordValueFunc;
      CVar5 = (*(this->KeywordValueFunc)._M_invoker)((_Any_data *)pfVar1,&local_58);
      if (CVar5 == No) {
        pp_Var2 = &(this->KeywordValueFunc).super__Function_base._M_manager;
        p_Var4 = *pp_Var2;
        if (p_Var4 != (_Manager_type)0x0) {
          (*p_Var4)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
          *pp_Var2 = (_Manager_type)0x0;
          (this->KeywordValueFunc)._M_invoker = (_Invoker_type)0x0;
        }
      }
      this->KeywordValuesSeen = this->KeywordValuesSeen + 1;
    }
  }
  else {
    FinishKeyword(this);
    pcVar8 = ((cVar6._M_current)->first)._M_str;
    (this->Keyword)._M_len = ((cVar6._M_current)->first)._M_len;
    (this->Keyword)._M_str = pcVar8;
    this->KeywordValuesSeen = 0;
    this->DoneWithPositional = true;
    pAVar3 = this->Bindings;
    if ((pAVar3->ParsedKeyword).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_58._M_len = ((cVar6._M_current)->first)._M_len;
      local_58._M_str = ((cVar6._M_current)->first)._M_str;
      (*(pAVar3->ParsedKeyword)._M_invoker)((_Any_data *)&pAVar3->ParsedKeyword,this,&local_58);
    }
    if (((cVar6._M_current)->second).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00341963:
      std::__throw_bad_function_call();
    }
    (*((cVar6._M_current)->second)._M_invoker)((_Any_data *)&(cVar6._M_current)->second,this);
  }
  return;
}

Assistant:

void Instance::Consume(std::size_t pos, cm::string_view arg)
{
  auto const it = this->Bindings.Keywords.Find(arg);
  if (it != this->Bindings.Keywords.end()) {
    this->FinishKeyword();
    this->Keyword = it->first;
    this->KeywordValuesSeen = 0;
    this->DoneWithPositional = true;
    if (this->Bindings.ParsedKeyword) {
      this->Bindings.ParsedKeyword(*this, it->first);
    }
    it->second(*this);
    return;
  }

  if (this->KeywordValueFunc) {
    switch (this->KeywordValueFunc(arg)) {
      case Continue::Yes:
        break;
      case Continue::No:
        this->KeywordValueFunc = nullptr;
        break;
    }
    ++this->KeywordValuesSeen;
    return;
  }

  if (!this->DoneWithPositional) {
    auto const pit = this->Bindings.Positions.Find(pos);
    if (pit != this->Bindings.Positions.end()) {
      pit->second(*this, pos, arg);
      return;
    }
  }

  if (this->UnparsedArguments != nullptr) {
    this->UnparsedArguments->emplace_back(arg);
  }
}